

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteHash
          (WrapperFieldGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  size_t sVar2;
  Nonnull<const_char_*> pcVar3;
  char *__s;
  string_view text;
  
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  if ((long)pDVar1->field_count_ < 1) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)pDVar1->field_count_,"index < field_count()");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if (pDVar1->fields_->type_ == '\x02') {
      __s = 
      "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n"
      ;
    }
    else {
      pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
      if ((long)pDVar1->field_count_ < 1) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,(long)pDVar1->field_count_,"index < field_count()");
      }
      else {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_0029a8be;
      __s = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
      if (pDVar1->fields_->type_ == '\x01') {
        __s = 
        "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n"
        ;
      }
    }
    sVar2 = strlen(__s);
    text._M_str = __s;
    text._M_len = sVar2;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&(this->super_FieldGeneratorBase).variables_,text);
    return;
  }
  WriteHash();
LAB_0029a8be:
  WriteHash();
}

Assistant:

void WrapperFieldGenerator::WriteHash(io::Printer* printer) {
  const char *text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n";
  }
  printer->Print(variables_, text);
}